

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  size_type *psVar1;
  EnumVal *pEVar2;
  pointer pcVar3;
  undefined8 uVar4;
  Import *pIVar5;
  undefined8 *puVar6;
  string *psVar7;
  string *extraout_RAX;
  string *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppEVar9;
  ulong uVar10;
  PythonStubGenerator *pPVar11;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c0;
  string local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  string *local_40;
  pointer local_38;
  
  paVar8 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"typing","");
  Imports::Import(imports,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar8) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(*(long *)this + 0x3f8) == '\x01') {
    anon_unknown_0::PythonStubGenerator::ModuleForFile
              (&local_a0,(PythonStubGenerator *)this,&(enum_def->super_Definition).file);
  }
  else {
    IdlNamer::NamespacedType_abi_cxx11_
              (&local_a0,(IdlNamer *)(this + 8),&enum_def->super_Definition);
  }
  pPVar11 = this + 8;
  (**(code **)(*(long *)(this + 8) + 0x78))(&local_c0,pPVar11,enum_def);
  pIVar5 = Imports::Import(imports,&local_a0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar8) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar8;
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  ppEVar9 = (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar9 != local_38) {
    do {
      pEVar2 = *ppEVar9;
      if (local_a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      pcVar3 = (pIVar5->name)._M_dataplus._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + (pIVar5->name)._M_string_length);
      std::__cxx11::string::append((char *)&local_60);
      (**(code **)(*(long *)pPVar11 + 0x98))(&local_80,pPVar11,pEVar2);
      uVar10 = 0xf;
      if (local_60 != local_50) {
        uVar10 = local_50[0];
      }
      if (uVar10 < (ulong)(local_78 + local_58)) {
        uVar10 = 0xf;
        if (local_80 != local_70) {
          uVar10 = local_70[0];
        }
        if (uVar10 < (ulong)(local_78 + local_58)) goto LAB_0027201f;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      }
      else {
LAB_0027201f:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
      }
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_c0.field_2._M_allocated_capacity = *psVar1;
        local_c0.field_2._8_8_ = puVar6[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar1;
        local_c0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_c0._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      ppEVar9 = ppEVar9 + 1;
    } while (ppEVar9 != local_38);
  }
  std::operator+(&local_c0,"typing.Literal[",&local_a0);
  psVar7 = (string *)std::__cxx11::string::append((char *)&local_c0);
  (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  paVar8 = &psVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar8) {
    uVar4 = *(undefined8 *)((long)&psVar7->field_2 + 8);
    (local_40->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&local_40->field_2 + 8) = uVar4;
  }
  else {
    (local_40->_M_dataplus)._M_p = pcVar3;
    (local_40->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_40->_M_string_length = psVar7->_M_string_length;
  (psVar7->_M_dataplus)._M_p = (pointer)paVar8;
  psVar7->_M_string_length = 0;
  (psVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    psVar7 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    psVar7 = extraout_RAX_00;
  }
  return psVar7;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }